

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzstepsolver.cpp
# Opt level: O1

void __thiscall
TPZStepSolver<std::complex<long_double>_>::TPZStepSolver
          (TPZStepSolver<std::complex<long_double>_> *this,
          TPZAutoPointer<TPZMatrix<std::complex<long_double>_>_> *refmat)

{
  TPZAutoPointer<TPZMatrix<std::complex<long_double>_>_> local_10;
  
  local_10 = (TPZAutoPointer<TPZMatrix<std::complex<long_double>_>_>)refmat->fRef;
  LOCK();
  ((local_10.fRef)->fCounter).super___atomic_base<int>._M_i =
       ((local_10.fRef)->fCounter).super___atomic_base<int>._M_i + 1;
  UNLOCK();
  TPZMatrixSolver<std::complex<long_double>_>::TPZMatrixSolver
            (&this->super_TPZMatrixSolver<std::complex<long_double>_>,&PTR_PTR_01848a90,&local_10);
  TPZAutoPointer<TPZMatrix<std::complex<long_double>_>_>::~TPZAutoPointer(&local_10);
  (this->super_TPZMatrixSolver<std::complex<long_double>_>).super_TPZSolver.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)&PTR__TPZStepSolver_01848a00;
  this->fNumIterations = -1;
  (this->fSingular).super__List_base<long,_std::allocator<long>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)&this->fSingular;
  (this->fSingular).super__List_base<long,_std::allocator<long>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&this->fSingular;
  (this->fSingular).super__List_base<long,_std::allocator<long>_>._M_impl._M_node._M_size = 0;
  this->fSolver = ENoSolver;
  this->fDecompose = ENoDecompose;
  this->fMaxIterations = 0;
  this->fNumVectors = 0;
  this->fPrecond = (TPZMatrixSolver<std::complex<long_double>_> *)0x0;
  this->fFromCurrent = 0;
  this->fTol = 0.0;
  this->fOverRelax = 0.0;
  return;
}

Assistant:

TPZStepSolver<TVar>::TPZStepSolver(TPZAutoPointer<TPZMatrix<TVar> > refmat) : TPZRegisterClassId(&TPZStepSolver::ClassId),TPZMatrixSolver<TVar>(refmat), fNumIterations(-1) {
	fPrecond = 0;
	ResetSolver();
}